

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O3

void __thiscall LinkedObjectFile::disassemble_functions(LinkedObjectFile *this)

{
  uint32_t *puVar1;
  pointer pvVar2;
  pointer pFVar3;
  pointer pvVar4;
  bool bVar5;
  int iVar6;
  pointer pFVar7;
  ulong uVar8;
  ulong uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  Instruction local_100;
  
  iVar6 = this->segments;
  if (0 < iVar6) {
    uVar11 = 0;
    do {
      pvVar2 = (this->functions_by_seg).
               super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->functions_by_seg).
                     super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
              -0x5555555555555555;
      uVar12 = uVar11;
      if (uVar8 < uVar11 || uVar8 - uVar11 == 0) {
LAB_0012e9e0:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
      }
      pFVar7 = pvVar2[uVar11].super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
               super__Vector_impl_data._M_start;
      pFVar3 = *(pointer *)
                ((long)&pvVar2[uVar11].super__Vector_base<Function,_std::allocator<Function>_>.
                        _M_impl.super__Vector_impl_data + 8);
      if (pFVar7 != pFVar3) {
        do {
          uVar8 = (ulong)pFVar7->start_word;
          if (pFVar7->start_word < pFVar7->end_word) {
            do {
              pvVar4 = (this->words_by_seg).
                       super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar9 = ((long)(this->words_by_seg).
                             super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
                      -0x5555555555555555;
              uVar12 = uVar11;
              if ((uVar9 < uVar11 || uVar9 - uVar11 == 0) ||
                 (lVar13 = *(long *)&pvVar4[uVar11].
                                     super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                     _M_impl.super__Vector_impl_data,
                 uVar9 = ((long)*(pointer *)
                                 ((long)&pvVar4[uVar11].
                                         super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>
                                         ._M_impl.super__Vector_impl_data + 8) - lVar13 >> 4) *
                         -0x5555555555555555, uVar12 = uVar8, uVar9 < uVar8 || uVar9 - uVar8 == 0))
              goto LAB_0012e9e0;
              decode_instruction(&local_100,(LinkedWord *)(lVar13 + uVar8 * 0x30),this,(int)uVar11,
                                 (int)uVar8);
              std::vector<Instruction,_std::allocator<Instruction>_>::emplace_back<Instruction>
                        (&pFVar7->instructions,&local_100);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100.dst[0].sym._M_dataplus._M_p != &local_100.dst[0].sym.field_2) {
                operator_delete(local_100.dst[0].sym._M_dataplus._M_p,
                                local_100.dst[0].sym.field_2._M_allocated_capacity + 1);
              }
              lVar13 = -0x90;
              paVar10 = &local_100.src[2].sym.field_2;
              do {
                if (paVar10 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar10->_M_allocated_capacity)[-2]) {
                  operator_delete((long *)(&paVar10->_M_allocated_capacity)[-2],
                                  paVar10->_M_allocated_capacity + 1);
                }
                paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(&paVar10->_M_allocated_capacity + -6);
                lVar13 = lVar13 + 0x30;
              } while (lVar13 != 0);
              bVar5 = Instruction::is_valid
                                (*(pointer *)
                                  ((long)&(pFVar7->instructions).
                                          super__Vector_base<Instruction,_std::allocator<Instruction>_>
                                          ._M_impl + 8) + -1);
              if (bVar5) {
                puVar1 = &(this->stats).decoded_ops;
                *puVar1 = *puVar1 + 1;
              }
              uVar8 = uVar8 + 1;
            } while ((long)uVar8 < (long)pFVar7->end_word);
          }
          pFVar7 = pFVar7 + 1;
        } while (pFVar7 != pFVar3);
        iVar6 = this->segments;
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)iVar6);
  }
  return;
}

Assistant:

void LinkedObjectFile::disassemble_functions() {
  for (int seg = 0; seg < segments; seg++) {
    for (auto& function : functions_by_seg.at(seg)) {
      for (auto word = function.start_word; word < function.end_word; word++) {
        // decode!
        function.instructions.push_back(
            decode_instruction(words_by_seg.at(seg).at(word), *this, seg, word));
        if (function.instructions.back().is_valid()) {
          stats.decoded_ops++;
        }
      }
    }
  }
}